

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void exchange_particles(int nm1,int nm2)

{
  bool bVar1;
  int iVar2;
  int receive_left;
  bool bVar3;
  int send_width;
  int send_left;
  uint rank;
  int x_diff;
  int pn_size;
  
  if (exchange_particles(int,int)::particle_numbers == '\0') {
    exchange_particles();
  }
  if (exchange_particles(int,int)::particles == '\0') {
    exchange_particles();
  }
  iVar2 = nz_global * ny_global * nm1;
  pn_size = nz_global * ny_global * nm2;
  if (pn_size < iVar2) {
    pn_size = iVar2;
  }
  if ((int)((ulong)((long)exchange_particles::particle_numbers.
                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                   (long)exchange_particles::particle_numbers.
                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start) >> 2) < pn_size) {
    std::vector<int,_std::allocator<int>_>::resize
              (&exchange_particles::particle_numbers,(long)pn_size);
  }
  iVar2 = 0;
  bVar3 = true;
  do {
    if (mpi_rank - (((uint)((ulong)(long)mpi_rank >> 0x1f) & 1) + mpi_rank & 0xfffffffe) == iVar2) {
      if (0 < mpi_rank) {
        rank = mpi_rank - 1;
        x_diff = nx_ich - nx_sr.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start[rank];
        receive_left = 0;
        iVar2 = nm1;
        send_left = nm1;
        send_width = nm2;
LAB_0011f844:
        exchange_particle_slices
                  (send_left,send_width,receive_left,iVar2,rank,
                   &exchange_particles::particle_numbers,pn_size,&exchange_particles::particles,
                   x_diff);
      }
    }
    else if (mpi_rank < n_sr + -1) {
      rank = mpi_rank + 1;
      x_diff = nx_sr.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start[mpi_rank] - nx_ich;
      send_left = *(int *)psr._M_t.
                          super___uniq_ptr_impl<spatial_region,_std::default_delete<spatial_region>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_spatial_region_*,_std::default_delete<spatial_region>_>
                          .super__Head_base<0UL,_spatial_region_*,_false>._M_head_impl - (nm2 + nm1)
      ;
      receive_left = *(int *)psr._M_t.
                             super___uniq_ptr_impl<spatial_region,_std::default_delete<spatial_region>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_spatial_region_*,_std::default_delete<spatial_region>_>
                             .super__Head_base<0UL,_spatial_region_*,_false>._M_head_impl - nm2;
      iVar2 = nm2;
      send_width = nm1;
      goto LAB_0011f844;
    }
    iVar2 = 1;
    bVar1 = !bVar3;
    bVar3 = false;
    if (bVar1) {
      return;
    }
  } while( true );
}

Assistant:

void exchange_particles(const int nm1, const int nm2) {
    static vector<int> particle_numbers{};
    static vector<particle> particles{};

    const int size1 = ny_global * nz_global * nm1;
    const int size2 = ny_global * nz_global * nm2;
    const int size = max(size1, size2);

    if (static_cast<int>(particle_numbers.size()) < size) {
        particle_numbers.resize(size);
    }

    for (int mod=0; mod<2; mod++) {

        // first even processes send, while odd receive, then vice versa
        if (mpi_rank % 2 == mod) {
            if (mpi_rank > 0) {
                exchange_particle_slices(nm1, nm2, 0, nm1, mpi_rank - 1, particle_numbers, size, particles,
                        -nx_sr[mpi_rank - 1] + nx_ich);
            }
        } else {
            if (mpi_rank < n_sr-1) {
                exchange_particle_slices(psr->get_nx() - nm2 - nm1, nm1, psr->get_nx() - nm2, nm2, mpi_rank + 1,
                        particle_numbers, size, particles, nx_sr[mpi_rank] - nx_ich);
            }
        }
    }

}